

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

bool __thiscall
QMarkdownTextEdit::increaseSelectedTextIndention
          (QMarkdownTextEdit *this,bool reverse,QString *indentCharacters)

{
  qsizetype *pqVar1;
  bool bVar2;
  byte bVar3;
  MoveMode MVar4;
  MoveMode MVar5;
  int iVar6;
  qsizetype qVar7;
  QString *pQVar8;
  QString *this_00;
  int local_5f0;
  QTextCursor local_5b0 [12];
  QFlags<QRegularExpression::MatchOption> local_5a4;
  QString local_5a0;
  QRegularExpressionMatch local_588 [12];
  QFlags<QRegularExpression::MatchOption> local_57c;
  QString local_578;
  QRegularExpressionMatch local_560 [8];
  QRegularExpressionMatch match;
  QFlags<QRegularExpression::PatternOption> local_554;
  QArrayDataPointer<char16_t> local_550;
  QString local_538;
  QRegularExpression local_520;
  QRegularExpression re;
  int local_510;
  int position;
  int i;
  int indentSize_1;
  QArrayDataPointer<char16_t> local_500;
  QString local_4e8;
  QRegularExpression local_4d0;
  QArrayDataPointer<char16_t> local_4c8;
  QString local_4b0;
  QString local_498;
  QArrayDataPointer<char16_t> local_480;
  QString local_468;
  QFlags<QRegularExpression::PatternOption> local_44c;
  QArrayDataPointer<char16_t> local_448;
  QString local_430;
  QString local_418;
  QString local_400;
  QRegularExpression local_3e8;
  QFlags<QRegularExpression::PatternOption> local_3dc;
  QArrayDataPointer<char16_t> local_3d8;
  QString local_3c0;
  QString local_3a8;
  QArrayDataPointer<char16_t> local_390;
  QString local_378;
  QString local_360;
  QString local_348;
  QRegularExpression local_330;
  QArrayDataPointer<char16_t> local_328;
  QString local_310;
  QFlags<QRegularExpression::PatternOption> local_2f4;
  QArrayDataPointer<char16_t> local_2f0;
  QString local_2d8;
  QString local_2c0;
  QArrayDataPointer<char16_t> local_2a8;
  QString local_290;
  QString local_278;
  QString local_260;
  QString local_248;
  QRegularExpression local_230;
  QArrayDataPointer<char16_t> local_228;
  QString local_210;
  int local_1f4;
  undefined1 local_1f0 [4];
  int indentSize;
  QString newText;
  QByteArray local_1c0;
  QByteArray local_1a8;
  undefined1 local_190 [8];
  QString newLine;
  int end;
  undefined1 local_150 [8];
  QString selectedText;
  QTextCursor cursor;
  QString *indentCharacters_local;
  bool reverse_local;
  QMarkdownTextEdit *this_local;
  char16_t *str_8;
  char16_t *str_7;
  char16_t *str_6;
  char16_t *str_3;
  char16_t *str;
  char16_t *str_5;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str_4;
  char16_t *str_9;
  char16_t *str_10;
  
  QPlainTextEdit::textCursor();
  QTextCursor::selectedText();
  bVar2 = QString::isEmpty((QString *)local_150);
  if (bVar2) {
    if (reverse) {
      qVar7 = QString::length(indentCharacters);
      for (local_510 = 1; local_510 <= (int)qVar7; local_510 = local_510 + 1) {
        re.d.d._4_4_ = QTextCursor::position();
        bVar3 = QTextCursor::atStart();
        if ((bVar3 & 1) == 0) {
          QTextCursor::setPosition((int)&selectedText + 0x10,re.d.d._4_4_ - KeepAnchor);
        }
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_550,(Data *)0x0,L"[\\t ]",5);
        QString::QString(&local_538,&local_550);
        QFlags<QRegularExpression::PatternOption>::QFlags(&local_554,NoPatternOption);
        QRegularExpression::QRegularExpression
                  (&local_520,(QString *)&local_538,(QFlags_conflict1 *)(ulong)local_554.i);
        QString::~QString(&local_538);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_550);
        QTextCursor::selectedText();
        QFlags<QRegularExpression::MatchOption>::QFlags(&local_57c,NoMatchOption);
        QRegularExpression::match
                  ((QString *)local_560,(longlong)&local_520,(MatchType)&local_578,
                   (QFlags_conflict1 *)0x0);
        QString::~QString(&local_578);
        bVar3 = QRegularExpressionMatch::hasMatch();
        if ((bVar3 & 1) == 0) {
          QTextCursor::setPosition((int)&selectedText + 0x10,re.d.d._4_4_);
          bVar3 = QTextCursor::atEnd();
          if ((bVar3 & 1) == 0) {
            QTextCursor::setPosition((int)&selectedText + 0x10,re.d.d._4_4_ + KeepAnchor);
          }
        }
        QTextCursor::selectedText();
        QFlags<QRegularExpression::MatchOption>::QFlags(&local_5a4,NoMatchOption);
        QRegularExpression::match
                  ((QString *)local_588,(longlong)&local_520,(MatchType)&local_5a0,
                   (QFlags_conflict1 *)0x0);
        QRegularExpressionMatch::operator=(local_560,local_588);
        QRegularExpressionMatch::~QRegularExpressionMatch(local_588);
        QString::~QString(&local_5a0);
        bVar3 = QRegularExpressionMatch::hasMatch();
        if ((bVar3 & 1) != 0) {
          QTextCursor::removeSelectedText();
        }
        QPlainTextEdit::textCursor();
        QTextCursor::operator=((QTextCursor *)&selectedText.d.size,local_5b0);
        QTextCursor::~QTextCursor(local_5b0);
        QRegularExpressionMatch::~QRegularExpressionMatch(local_560);
        QRegularExpression::~QRegularExpression(&local_520);
      }
    }
    else {
      QTextCursor::insertText((QString *)&selectedText.d.size);
    }
  }
  else {
    MVar4 = QTextCursor::selectionEnd();
    MVar5 = QTextCursor::selectionStart();
    QTextCursor::setPosition((int)&selectedText + 0x10,MVar5);
    QTextCursor::movePosition((int)&selectedText + NextBlock,4,0);
    QTextCursor::setPosition((int)&selectedText + 0x10,MVar4);
    QPlainTextEdit::setTextCursor((QTextCursor *)this);
    QTextCursor::selectedText();
    pqVar1 = &newLine.d.size;
    QString::operator=((QString *)local_150,(QString *)pqVar1);
    QString::~QString((QString *)pqVar1);
    pqVar1 = &newText.d.size;
    QArrayDataPointer<char>::QArrayDataPointer
              ((QArrayDataPointer<char> *)pqVar1,(Data *)0x0,"e280a9",6);
    QByteArray::QByteArray(&local_1c0,(DataPointer *)pqVar1);
    QByteArray::fromHex((QByteArray *)&local_1a8);
    QString::fromUtf8<void>((QString *)local_190,&local_1a8);
    QByteArray::~QByteArray(&local_1a8);
    QByteArray::~QByteArray(&local_1c0);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&newText.d.size);
    QString::QString((QString *)local_1f0);
    if (reverse) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_228,(Data *)0x0,L"\t",1);
      QString::QString(&local_210,&local_228);
      bVar2 = ::operator==(indentCharacters,&local_210);
      if (bVar2) {
        local_5f0 = 4;
      }
      else {
        qVar7 = QString::length(indentCharacters);
        local_5f0 = (int)qVar7;
      }
      QString::~QString(&local_210);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
      local_1f4 = local_5f0;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_2a8,(Data *)0x0,L"(\\t| {1,",8);
      QString::QString(&local_290,&local_2a8);
      operator+(&local_278,(QString *)local_190,&local_290);
      QString::number((int)&local_2c0,local_1f4);
      operator+(&local_260,&local_278,&local_2c0);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_2f0,(Data *)0x0,L"})",2);
      QString::QString(&local_2d8,&local_2f0);
      operator+(&local_248,&local_260,&local_2d8);
      QFlags<QRegularExpression::PatternOption>::QFlags(&local_2f4,NoPatternOption);
      QRegularExpression::QRegularExpression
                (&local_230,(QString *)&local_248,(QFlags_conflict1 *)(ulong)local_2f4.i);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_328,(Data *)0x0,L"\n",1);
      QString::QString(&local_310,&local_328);
      pQVar8 = (QString *)QString::replace((QRegularExpression *)local_150,(QString *)&local_230);
      QString::operator=((QString *)local_1f0,pQVar8);
      QString::~QString(&local_310);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_328);
      QRegularExpression::~QRegularExpression(&local_230);
      QString::~QString(&local_248);
      QString::~QString(&local_2d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2f0);
      QString::~QString(&local_260);
      QString::~QString(&local_2c0);
      QString::~QString(&local_278);
      QString::~QString(&local_290);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2a8);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_390,(Data *)0x0,L"^(\\t| {1,",9);
      QString::QString(&local_378,&local_390);
      QString::number((int)&local_3a8,local_1f4);
      operator+(&local_360,&local_378,&local_3a8);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_3d8,(Data *)0x0,L"})",2);
      QString::QString(&local_3c0,&local_3d8);
      operator+(&local_348,&local_360,&local_3c0);
      QFlags<QRegularExpression::PatternOption>::QFlags(&local_3dc,NoPatternOption);
      QRegularExpression::QRegularExpression
                (&local_330,(QString *)&local_348,(QFlags_conflict1 *)(ulong)local_3dc.i);
      QString::remove((QString *)local_1f0,(char *)&local_330);
      QRegularExpression::~QRegularExpression(&local_330);
      QString::~QString(&local_348);
      QString::~QString(&local_3c0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_3d8);
      QString::~QString(&local_360);
      QString::~QString(&local_3a8);
      QString::~QString(&local_378);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_390);
    }
    else {
      QRegularExpression::escape(&local_418,(QString *)local_190);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_448,(Data *)0x0,L"$",1);
      QString::QString(&local_430,&local_448);
      operator+(&local_400,&local_418,&local_430);
      QFlags<QRegularExpression::PatternOption>::QFlags(&local_44c,NoPatternOption);
      QRegularExpression::QRegularExpression
                (&local_3e8,(QString *)&local_400,(QFlags_conflict1 *)(ulong)local_44c.i);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_480,(Data *)0x0,L"\n",1);
      QString::QString(&local_468,&local_480);
      pQVar8 = (QString *)QString::replace((QRegularExpression *)local_150,(QString *)&local_3e8);
      QString::operator=((QString *)local_1f0,pQVar8);
      QString::~QString(&local_468);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_480);
      QRegularExpression::~QRegularExpression(&local_3e8);
      QString::~QString(&local_400);
      QString::~QString(&local_430);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_448);
      QString::~QString(&local_418);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_4c8,(Data *)0x0,L"\n",1);
      QString::QString(&local_4b0,&local_4c8);
      operator+(&local_498,&local_4b0,indentCharacters);
      this_00 = (QString *)
                QString::replace((QString *)local_1f0,(QString *)local_190,
                                 (CaseSensitivity)&local_498);
      QString::prepend(this_00,indentCharacters);
      QString::~QString(&local_498);
      QString::~QString(&local_4b0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4c8);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_500,(Data *)0x0,L"\\t$",3);
      QString::QString(&local_4e8,&local_500);
      QFlags<QRegularExpression::PatternOption>::QFlags
                ((QFlags<QRegularExpression::PatternOption> *)&indentSize_1,NoPatternOption);
      QRegularExpression::QRegularExpression
                (&local_4d0,(QString *)&local_4e8,(QFlags_conflict1 *)(ulong)(uint)indentSize_1);
      QString::remove((QString *)local_1f0,(char *)&local_4d0);
      QRegularExpression::~QRegularExpression(&local_4d0);
      QString::~QString(&local_4e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_500);
    }
    QTextCursor::insertText((QString *)&selectedText.d.size);
    iVar6 = QTextCursor::position();
    qVar7 = QString::size((QString *)local_1f0);
    QTextCursor::setPosition((int)&selectedText + 0x10,iVar6 - (int)qVar7);
    QPlainTextEdit::setTextCursor((QTextCursor *)this);
    QString::~QString((QString *)local_1f0);
    QString::~QString((QString *)local_190);
  }
  QString::~QString((QString *)local_150);
  QTextCursor::~QTextCursor((QTextCursor *)&selectedText.d.size);
  return true;
}

Assistant:

bool QMarkdownTextEdit::increaseSelectedTextIndention(
    bool reverse, const QString &indentCharacters) {
    QTextCursor cursor = this->textCursor();
    QString selectedText = cursor.selectedText();

    if (!selectedText.isEmpty()) {
        // Start the selection at start of the first block of the selection
        int end = cursor.selectionEnd();
        cursor.setPosition(cursor.selectionStart());
        cursor.movePosition(QTextCursor::StartOfBlock, QTextCursor::MoveAnchor);
        cursor.setPosition(end, QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);
        selectedText = cursor.selectedText();

        // we need this strange newline character we are getting in the
        // selected text for newlines
        const QString newLine =
            QString::fromUtf8(QByteArray::fromHex(QByteArrayLiteral("e280a9")));
        QString newText;

        if (reverse) {
            // un-indent text

            //          QSettings settings;
            const int indentSize = indentCharacters == QStringLiteral("\t")
                                       ? 4
                                       : indentCharacters.length();

            // remove leading \t or spaces in following lines
            newText = selectedText.replace(
                QRegularExpression(newLine + QStringLiteral("(\\t| {1,") +
                                   QString::number(indentSize) +
                                   QStringLiteral("})")),
                QStringLiteral("\n"));

            // remove leading \t or spaces in first line
            newText.remove(QRegularExpression(QStringLiteral("^(\\t| {1,") +
                                              QString::number(indentSize) +
                                              QStringLiteral("})")));
        } else {
            // replace trailing new line to prevent an indent of the line after
            // the selection
            newText = selectedText.replace(
                QRegularExpression(QRegularExpression::escape(newLine) +
                                   QStringLiteral("$")),
                QStringLiteral("\n"));

            // indent text
            newText.replace(newLine, QStringLiteral("\n") + indentCharacters)
                .prepend(indentCharacters);

            // remove trailing \t
            newText.remove(QRegularExpression(QStringLiteral("\\t$")));
        }

        // insert the new text
        cursor.insertText(newText);

        // update the selection to the new text
        cursor.setPosition(cursor.position() - newText.size(),
                           QTextCursor::KeepAnchor);
        this->setTextCursor(cursor);

        return true;
    } else if (reverse) {
        const int indentSize = indentCharacters.length();

        // do the check as often as we have characters to un-indent
        for (int i = 1; i <= indentSize; i++) {
            // if nothing was selected but we want to reverse the indention
            // check if there is a \t in front or after the cursor and remove it
            // if so
            const int position = cursor.position();

            if (!cursor.atStart()) {
                // get character in front of cursor
                cursor.setPosition(position - 1, QTextCursor::KeepAnchor);
            }

            // check for \t or space in front of cursor
            QRegularExpression re(QStringLiteral("[\\t ]"));
            QRegularExpressionMatch match = re.match(cursor.selectedText());

            if (!match.hasMatch()) {
                // (select to) check for \t or space after the cursor
                cursor.setPosition(position);

                if (!cursor.atEnd()) {
                    cursor.setPosition(position + 1, QTextCursor::KeepAnchor);
                }
            }

            match = re.match(cursor.selectedText());

            if (match.hasMatch()) {
                cursor.removeSelectedText();
            }

            cursor = this->textCursor();
        }

        return true;
    }

    // else just insert indentCharacters
    cursor.insertText(indentCharacters);

    return true;
}